

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseLongToken(State *state,char *long_token)

{
  bool bVar1;
  char *pcVar2;
  int local_30;
  int i;
  ComplexityGuard guard;
  char *long_token_local;
  State *state_local;
  
  guard.state_ = (State *)long_token;
  anon_unknown_3::ComplexityGuard::ComplexityGuard((ComplexityGuard *)&i,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&i);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    for (local_30 = 0; *(char *)((long)&(guard.state_)->mangled_begin + (long)local_30) != '\0';
        local_30 = local_30 + 1) {
      pcVar2 = RemainingInput(state);
      if (pcVar2[local_30] != *(char *)((long)&(guard.state_)->mangled_begin + (long)local_30)) {
        state_local._7_1_ = false;
        goto LAB_0063e1d1;
      }
    }
    (state->parse_state).mangled_idx = local_30 + (state->parse_state).mangled_idx;
    anon_unknown_3::UpdateHighWaterMark(state);
    state_local._7_1_ = true;
  }
LAB_0063e1d1:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&i);
  return state_local._7_1_;
}

Assistant:

static bool ParseLongToken(State *state, const char *long_token) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  int i = 0;
  for (; long_token[i] != '\0'; ++i) {
    // Note that we cannot run off the end of the NUL-terminated input here.
    // Inside the loop body, long_token[i] is known to be different from NUL.
    // So if we read the NUL on the end of the input here, we return at once.
    if (RemainingInput(state)[i] != long_token[i]) return false;
  }
  state->parse_state.mangled_idx += i;
  UpdateHighWaterMark(state);
  return true;
}